

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_cbor_object(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                  *this,size_t len,cbor_tag_handler_t tag_handler)

{
  byte bVar1;
  bool bVar2;
  char_int_type cVar3;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  string_t key;
  string_t *in_stack_000000c0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_000000c8;
  cbor_tag_handler_t in_stack_000003b0;
  undefined1 in_stack_000003b7;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_000003b8;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  byte in_stack_ffffffffffffff95;
  byte in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  byte local_62;
  ulong local_48;
  string local_40 [40];
  ulong local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))(*(long **)(in_RDI + 0x28),in_RSI);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    if (local_18 != 0) {
      std::__cxx11::string::string(local_40);
      if (local_18 == 0xffffffffffffffff) {
        while (cVar3 = get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,
                                                CONCAT15(in_stack_ffffffffffffff95,
                                                         CONCAT14(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90))))),
              cVar3 != 0xff) {
          in_stack_ffffffffffffff97 = get_cbor_string(in_stack_000000c8,in_stack_000000c0);
          in_stack_ffffffffffffff96 = 1;
          if ((bool)in_stack_ffffffffffffff97) {
            in_stack_ffffffffffffff95 =
                 (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                           (*(long **)(in_RDI + 0x28),local_40);
            in_stack_ffffffffffffff96 = in_stack_ffffffffffffff95 ^ 0xff;
          }
          if ((in_stack_ffffffffffffff96 & 1) != 0) {
            local_1 = 0;
            bVar2 = true;
            goto LAB_00274c3b;
          }
          in_stack_ffffffffffffff94 =
               parse_cbor_internal(in_stack_000003b8,(bool)in_stack_000003b7,in_stack_000003b0);
          if (((in_stack_ffffffffffffff94 ^ 0xff) & 1) != 0) {
            local_1 = 0;
            bVar2 = true;
            goto LAB_00274c3b;
          }
          std::__cxx11::string::clear();
        }
      }
      else {
        for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
          get((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
               *)CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT15(in_stack_ffffffffffffff95,
                                            CONCAT14(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90)))));
          bVar2 = get_cbor_string(in_stack_000000c8,in_stack_000000c0);
          local_62 = 1;
          if (bVar2) {
            local_62 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                                 (*(long **)(in_RDI + 0x28),local_40);
            local_62 = local_62 ^ 0xff;
          }
          if ((local_62 & 1) != 0) {
            local_1 = 0;
            bVar2 = true;
            goto LAB_00274c3b;
          }
          bVar2 = parse_cbor_internal(in_stack_000003b8,(bool)in_stack_000003b7,in_stack_000003b0);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            bVar2 = true;
            goto LAB_00274c3b;
          }
          std::__cxx11::string::clear();
        }
      }
      bVar2 = false;
LAB_00274c3b:
      std::__cxx11::string::~string(local_40);
      if (bVar2) goto LAB_00274c68;
    }
    local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x48))();
    local_1 = local_1 & 1;
  }
  else {
    local_1 = 0;
  }
LAB_00274c68:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_cbor_object(const std::size_t len,
                         const cbor_tag_handler_t tag_handler)
    {
        if (JSON_HEDLEY_UNLIKELY(!sax->start_object(len)))
        {
            return false;
        }

        if (len != 0)
        {
            string_t key;
            if (len != static_cast<std::size_t>(-1))
            {
                for (std::size_t i = 0; i < len; ++i)
                {
                    get();
                    if (JSON_HEDLEY_UNLIKELY(!get_cbor_string(key) || !sax->key(key)))
                    {
                        return false;
                    }

                    if (JSON_HEDLEY_UNLIKELY(!parse_cbor_internal(true, tag_handler)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
            else
            {
                while (get() != 0xFF)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_cbor_string(key) || !sax->key(key)))
                    {
                        return false;
                    }

                    if (JSON_HEDLEY_UNLIKELY(!parse_cbor_internal(true, tag_handler)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
        }

        return sax->end_object();
    }